

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagStackFrame.cpp
# Opt level: O2

BOOL __thiscall Js::DiagStackFrame::IsThisAvailable(DiagStackFrame *this)

{
  bool bVar1;
  int iVar2;
  BOOL BVar3;
  uint uVar4;
  undefined4 extraout_var;
  ParseableFunctionInfo *this_00;
  
  iVar2 = (*this->_vptr_DiagStackFrame[2])();
  BVar3 = JavascriptFunction::IsLambda((JavascriptFunction *)CONCAT44(extraout_var,iVar2));
  if (BVar3 == 0) {
    uVar4 = 1;
  }
  else {
    this_00 = JavascriptFunction::GetParseableFunctionInfo
                        ((JavascriptFunction *)CONCAT44(extraout_var,iVar2));
    bVar1 = FunctionProxy::GetCapturesThis(&this_00->super_FunctionProxy);
    uVar4 = (uint)bVar1;
  }
  return uVar4;
}

Assistant:

BOOL DiagStackFrame::IsThisAvailable()
    {
        Js::JavascriptFunction* scopeFunction = this->GetJavascriptFunction();
        return !scopeFunction->IsLambda() || scopeFunction->GetParseableFunctionInfo()->GetCapturesThis();
    }